

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value * __thiscall toml::Value::push(Value *this,Value *v)

{
  bool bVar1;
  reference pvVar2;
  Value *in_RDI;
  char (*in_stack_00000170) [38];
  value_type *in_stack_ffffffffffffffa8;
  Value *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  anon_union_8_8_51f126cb_for_Value_2 this_00;
  
  bVar1 = valid(in_RDI);
  if (bVar1) {
    bVar1 = is<std::vector<toml::Value,std::allocator<toml::Value>>>(in_RDI);
    if (!bVar1) {
      failwith<char_const(&)[38]>(in_stack_00000170);
    }
  }
  else {
    local_38._0_4_ = NULL_TYPE;
    local_38._4_4_ = 0;
    this_00.null_ = (Value *)0x0;
    in_stack_ffffffffffffffa8 = (value_type *)&local_38;
    std::vector<toml::Value,_std::allocator<toml::Value>_>::vector
              ((vector<toml::Value,_std::allocator<toml::Value>_> *)0x233fd0);
    Value(in_stack_ffffffffffffffc0,(Array *)in_stack_ffffffffffffffb8);
    operator=(in_stack_ffffffffffffffb8,in_RDI);
    ~Value((Value *)this_00.string_);
    std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector
              ((vector<toml::Value,_std::allocator<toml::Value>_> *)in_stack_ffffffffffffffc0);
  }
  std::vector<toml::Value,_std::allocator<toml::Value>_>::push_back
            ((vector<toml::Value,_std::allocator<toml::Value>_> *)in_RDI,in_stack_ffffffffffffffa8);
  pvVar2 = std::vector<toml::Value,_std::allocator<toml::Value>_>::back
                     ((vector<toml::Value,_std::allocator<toml::Value>_> *)in_RDI);
  return pvVar2;
}

Assistant:

inline Value* Value::push(Value&& v)
{
    if (!valid())
        *this = Value((Array()));
    else if (!is<Array>())
        failwith("type must be array to do push(Value).");

    array_->push_back(std::move(v));
    return &array_->back();
}